

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_23::RecordMessageNames
          (anon_unknown_23 *this,DescriptorProto *desc_proto,string_view prefix,
          btree_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *output)

{
  string_view pc;
  bool bVar1;
  LogMessage *pLVar2;
  string *psVar3;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  reference this_01;
  undefined1 auVar4 [16];
  string_view prefix_00;
  DescriptorProto *d;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::DescriptorProto> *__range2;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_bool>
  local_120;
  AlphaNum local_108;
  AlphaNum local_d8;
  DescriptorProto *local_a8;
  size_t local_a0;
  AlphaNum local_98;
  undefined1 local_68 [8];
  string full_name;
  LogMessage local_40;
  Voidify local_29;
  btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
  *local_28;
  btree_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output_local;
  DescriptorProto *desc_proto_local;
  string_view prefix_local;
  
  local_28 = (btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
              *)prefix._M_str;
  prefix_local._M_len = prefix._M_len;
  output_local = (btree_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this;
  desc_proto_local = desc_proto;
  bVar1 = DescriptorProto::has_name((DescriptorProto *)this);
  full_name.field_2._M_local_buf[0xf] = '\0';
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x32,"desc_proto.has_name()");
    full_name.field_2._M_local_buf[0xf] = '\x01';
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
  }
  if ((full_name.field_2._M_local_buf[0xf] & 1U) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&desc_proto_local);
  if (bVar1) {
    psVar3 = DescriptorProto::name_abi_cxx11_((DescriptorProto *)output_local);
    std::__cxx11::string::string((string *)local_68,(string *)psVar3);
  }
  else {
    local_a8 = desc_proto_local;
    local_a0 = prefix_local._M_len;
    pc._M_str = (char *)prefix_local._M_len;
    pc._M_len = (size_t)desc_proto_local;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_98,pc);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_d8,".");
    psVar3 = DescriptorProto::name_abi_cxx11_((DescriptorProto *)output_local);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_108,psVar3);
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_68,(lts_20250127 *)&local_98,&local_d8,&local_108,(AlphaNum *)output)
    ;
  }
  absl::lts_20250127::container_internal::
  btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
  ::insert(&local_120,local_28,(value_type *)local_68);
  this_00 = DescriptorProto::nested_type((DescriptorProto *)output_local);
  __end2 = RepeatedPtrField<google::protobuf::DescriptorProto>::begin(this_00);
  d = (DescriptorProto *)RepeatedPtrField<google::protobuf::DescriptorProto>::end(this_00);
  while (bVar1 = internal::operator!=(&__end2,(iterator *)&d), bVar1) {
    this_01 = internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator*
                        (&__end2);
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
    prefix_00._M_len = auVar4._8_8_;
    prefix_00._M_str = (char *)local_28;
    RecordMessageNames((anon_unknown_23 *)this_01,auVar4._0_8_,prefix_00,output);
    internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator++(&__end2);
  }
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void RecordMessageNames(const DescriptorProto& desc_proto,
                        absl::string_view prefix,
                        absl::btree_set<std::string>* output) {
  ABSL_CHECK(desc_proto.has_name());
  std::string full_name = prefix.empty()
                              ? desc_proto.name()
                              : absl::StrCat(prefix, ".", desc_proto.name());
  output->insert(full_name);

  for (const auto& d : desc_proto.nested_type()) {
    RecordMessageNames(d, full_name, output);
  }
}